

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O2

void Executor::declareSequence(treeNode *node,string *flag)

{
  treeNode *ptVar1;
  treeNode *ptVar2;
  bool bVar3;
  AttrKind AVar4;
  Var *pVVar5;
  void *extraout_RAX;
  Error in_stack_ffffffffffffff6c;
  string local_90;
  string local_70;
  string local_50;
  
  if ((node->kind).stmtKind != doRpt) {
    ptVar2 = node->child[0];
    if (ptVar2->child[0] != (treeNode *)0x0) goto LAB_0010b53a;
    ptVar1 = node->child[1];
    pVVar5 = (Var *)operator_new(0x38);
    (pVVar5->text)._M_dataplus._M_p = (pointer)0x0;
    (pVVar5->text)._M_string_length = 0;
    (pVVar5->text).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pVVar5->text).field_2 + 8) = 0;
    *(undefined8 *)pVVar5 = 0;
    pVVar5->array = (void *)0x0;
    *(undefined8 *)&pVVar5->kind = 0;
    (pVVar5->text)._M_dataplus._M_p = (pointer)&(pVVar5->text).field_2;
    (pVVar5->text).field_2._M_local_buf[0] = '\0';
    if (ptVar1->sibling != (treeNode *)0x0) {
LAB_0010b577:
      reportError(in_stack_ffffffffffffff6c);
    }
    exp(0.0);
    bVar3 = std::operator==(flag,"int");
    if (bVar3) {
      if (*(int *)((long)extraout_RAX + 0x50) != 0) goto LAB_0010b577;
      pVVar5->value = *(Value *)((long)extraout_RAX + 0x54);
      AVar4 = Integer;
LAB_0010b4f4:
      pVVar5->kind = AVar4;
    }
    else {
      bVar3 = std::operator==(flag,"float");
      if (bVar3) {
        if (*(int *)((long)extraout_RAX + 0x50) != 1) goto LAB_0010b577;
        pVVar5->value = *(Value *)((long)extraout_RAX + 0x54);
        AVar4 = Decmical;
        goto LAB_0010b4f4;
      }
      bVar3 = std::operator==(flag,"bool");
      if (bVar3) {
        if (*(int *)((long)extraout_RAX + 0x50) != 2) goto LAB_0010b577;
        (pVVar5->value).boolean = *(bool *)((long)extraout_RAX + 0x54);
        AVar4 = Boolean;
        goto LAB_0010b4f4;
      }
      bVar3 = std::operator==(flag,"string");
      if (bVar3) {
        if (*(int *)((long)extraout_RAX + 0x50) != 3) goto LAB_0010b577;
        std::__cxx11::string::_M_assign((string *)&pVVar5->text);
        AVar4 = Text;
        goto LAB_0010b4f4;
      }
    }
    std::__cxx11::string::string((string *)&local_70,(string *)&ptVar2->text);
    setVar(&local_70,pVVar5);
    std::__cxx11::string::~string((string *)&local_70);
    if (extraout_RAX != (void *)0x0) {
      std::__cxx11::string::~string((string *)((long)extraout_RAX + 0x30));
    }
    operator_delete(extraout_RAX);
    goto LAB_0010b53a;
  }
  pVVar5 = (Var *)operator_new(0x38);
  (pVVar5->text)._M_dataplus._M_p = (pointer)0x0;
  (pVVar5->text)._M_string_length = 0;
  *(undefined8 *)&pVVar5->kind = 0;
  (pVVar5->text).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(pVVar5->text).field_2 + 8) = 0;
  *(undefined8 *)pVVar5 = 0;
  pVVar5->array = (void *)0x0;
  (pVVar5->text)._M_dataplus._M_p = (pointer)&(pVVar5->text).field_2;
  (pVVar5->text).field_2._M_local_buf[0] = '\0';
  bVar3 = std::operator==(flag,"int");
  if (bVar3) {
    (pVVar5->value).integer = 0;
    AVar4 = Integer;
LAB_0010b466:
    pVVar5->kind = AVar4;
  }
  else {
    bVar3 = std::operator==(flag,"float");
    if (bVar3) {
      (pVVar5->value).integer = 0;
      AVar4 = Decmical;
      goto LAB_0010b466;
    }
    bVar3 = std::operator==(flag,"bool");
    if (bVar3) {
      (pVVar5->value).boolean = false;
      AVar4 = Boolean;
      goto LAB_0010b466;
    }
    bVar3 = std::operator==(flag,"string");
    if (bVar3) {
      std::__cxx11::string::assign((char *)&pVVar5->text);
      AVar4 = Text;
      goto LAB_0010b466;
    }
  }
  std::__cxx11::string::string((string *)&local_50,(string *)&node->text);
  setVar(&local_50,pVVar5);
  std::__cxx11::string::~string((string *)&local_50);
LAB_0010b53a:
  ptVar2 = node->sibling;
  if (ptVar2 != (treeNode *)0x0) {
    std::__cxx11::string::string((string *)&local_90,(string *)flag);
    declareSequence(ptVar2,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return;
}

Assistant:

void declareSequence(treeNode* node,string flag)
    {
        auto id = node->child[0];
        auto val = node->child[1];
        if(node->kind.expKind==ExpKind::idExp)
        {
            auto defalutVal = new Var();
            if(flag=="int")         {defalutVal->value.integer=0;defalutVal->kind=AttrKind::Integer;}
            else if(flag=="float")  {defalutVal->value.decmical=0;defalutVal->kind=AttrKind::Decmical;}
            else if(flag=="bool")   {defalutVal->value.boolean=false;defalutVal->kind=AttrKind::Boolean;}
            else if(flag=="string") {defalutVal->text="";defalutVal->kind=AttrKind::Text;}
            setVar(node->text,defalutVal);
        }
        else if(id->child[0]!=nullptr)//是数组！麻烦死了
        {
            // auto p1 = id->child[0];
            // auto p2 = val;
            
        }
        else
        {
            auto var = new Var();
            if(val->sibling!=nullptr)reportError(Error::errorType);
            val = exp(val);
            if(flag=="int")
            {
                if(val->attrKind!=AttrKind::Integer)reportError(Error::errorType);
                var->value.integer=val->attr.integer;
                var->kind=AttrKind::Integer;
            }
            else if(flag=="float")
            {
                if(val->attrKind!=AttrKind::Decmical)reportError(Error::errorType);
                var->value.decmical=val->attr.decmical;
                var->kind=AttrKind::Decmical;
            }
            else if(flag=="bool")
            {
                if(val->attrKind!=AttrKind::Boolean)reportError(Error::errorType);
                var->value.boolean=val->attr.boolean;
                var->kind=AttrKind::Boolean;
            }
            else if(flag=="string")
            {
                if(val->attrKind!=AttrKind::Text)reportError(Error::errorType);
                var->text=val->text;
                var->kind=AttrKind::Text;
            }
            setVar(id->text,var);
            delete val;
        }
        if(node->sibling!=nullptr)declareSequence(node->sibling,flag);
    }